

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Address.cpp
# Opt level: O0

void __thiscall Network::Address::URL::normalizePath(URL *this,String *pathToNormalize)

{
  uchar *puVar1;
  bool bVar2;
  int iVar3;
  bool local_182;
  String local_138;
  String local_128;
  int local_114;
  int firstSlash;
  int local_fc;
  int lastSegmentPos;
  String local_e8;
  String local_d8;
  String local_c8;
  String local_b8;
  String local_a8;
  String local_98;
  String local_88;
  String local_78;
  String local_68;
  String local_58;
  String local_48 [2];
  undefined1 local_28 [8];
  String outputStack;
  String *pathToNormalize_local;
  URL *this_local;
  
  outputStack.super_tagbstring.data = (uchar *)pathToNormalize;
  Bstrlib::String::String((String *)local_28);
  while (iVar3 = Bstrlib::String::getLength((String *)outputStack.super_tagbstring.data), iVar3 != 0
        ) {
    Bstrlib::String::midString(local_48,(int)outputStack.super_tagbstring.data,0);
    bVar2 = Bstrlib::String::operator==(local_48,"../");
    Bstrlib::String::~String(local_48);
    iVar3 = (int)outputStack.super_tagbstring.data;
    if (bVar2) {
      Bstrlib::String::getLength((String *)outputStack.super_tagbstring.data);
      Bstrlib::String::midString(&local_58,iVar3,3);
      Bstrlib::String::operator=((String *)outputStack.super_tagbstring.data,&local_58);
      Bstrlib::String::~String(&local_58);
    }
    else {
      Bstrlib::String::midString(&local_68,iVar3,0);
      bVar2 = Bstrlib::String::operator==(&local_68,"./");
      Bstrlib::String::~String(&local_68);
      iVar3 = (int)outputStack.super_tagbstring.data;
      if (bVar2) {
        Bstrlib::String::getLength((String *)outputStack.super_tagbstring.data);
        Bstrlib::String::midString(&local_78,iVar3,2);
        Bstrlib::String::operator=((String *)outputStack.super_tagbstring.data,&local_78);
        Bstrlib::String::~String(&local_78);
      }
      else {
        Bstrlib::String::midString(&local_88,iVar3,0);
        bVar2 = Bstrlib::String::operator==(&local_88,"/./");
        Bstrlib::String::~String(&local_88);
        puVar1 = outputStack.super_tagbstring.data;
        if (bVar2) {
          Bstrlib::String::getLength((String *)outputStack.super_tagbstring.data);
          Bstrlib::String::midString(&local_a8,(int)puVar1,3);
          Bstrlib::operator+((Bstrlib *)&local_98,"/",&local_a8);
          Bstrlib::String::operator=((String *)outputStack.super_tagbstring.data,&local_98);
          Bstrlib::String::~String(&local_98);
          Bstrlib::String::~String(&local_a8);
        }
        else {
          bVar2 = Bstrlib::String::operator==((String *)outputStack.super_tagbstring.data,"/.");
          iVar3 = (int)outputStack.super_tagbstring.data;
          if (bVar2) {
            Bstrlib::String::getLength((String *)outputStack.super_tagbstring.data);
            Bstrlib::String::midString(&local_c8,iVar3,2);
            Bstrlib::operator+((Bstrlib *)&local_b8,"/",&local_c8);
            Bstrlib::String::operator=((String *)outputStack.super_tagbstring.data,&local_b8);
            Bstrlib::String::~String(&local_b8);
            Bstrlib::String::~String(&local_c8);
          }
          else {
            Bstrlib::String::midString(&local_d8,iVar3,0);
            bVar2 = Bstrlib::String::operator==(&local_d8,"/..");
            local_182 = true;
            if (!bVar2) {
              local_182 = Bstrlib::String::operator==
                                    ((String *)outputStack.super_tagbstring.data,"/../");
            }
            Bstrlib::String::~String(&local_d8);
            puVar1 = outputStack.super_tagbstring.data;
            if (local_182 == false) {
              iVar3 = Bstrlib::String::invFindAnyChar
                                ((String *)outputStack.super_tagbstring.data,".",0);
              if (iVar3 == -1) {
                Bstrlib::String::operator=((String *)outputStack.super_tagbstring.data,"");
              }
              else {
                local_114 = Bstrlib::String::Find((String *)outputStack.super_tagbstring.data,'/',0)
                ;
                if (local_114 == 0) {
                  local_114 = Bstrlib::String::Find
                                        ((String *)outputStack.super_tagbstring.data,'/',1);
                }
                if (local_114 == -1) {
                  Bstrlib::String::operator+=
                            ((String *)local_28,(String *)outputStack.super_tagbstring.data);
                  Bstrlib::String::operator=((String *)outputStack.super_tagbstring.data,"");
                }
                else {
                  Bstrlib::String::midString(&local_128,(int)outputStack.super_tagbstring.data,0);
                  Bstrlib::String::operator+=((String *)local_28,&local_128);
                  Bstrlib::String::~String(&local_128);
                  puVar1 = outputStack.super_tagbstring.data;
                  iVar3 = local_114;
                  Bstrlib::String::getLength((String *)outputStack.super_tagbstring.data);
                  Bstrlib::String::midString(&local_138,(int)puVar1,iVar3);
                  Bstrlib::String::operator=((String *)outputStack.super_tagbstring.data,&local_138)
                  ;
                  Bstrlib::String::~String(&local_138);
                }
              }
            }
            else {
              Bstrlib::String::getLength((String *)outputStack.super_tagbstring.data);
              Bstrlib::String::midString((String *)&stack0xffffffffffffff08,(int)puVar1,4);
              Bstrlib::operator+((Bstrlib *)&local_e8,"/",(String *)&stack0xffffffffffffff08);
              Bstrlib::String::operator=((String *)outputStack.super_tagbstring.data,&local_e8);
              Bstrlib::String::~String(&local_e8);
              Bstrlib::String::~String((String *)&stack0xffffffffffffff08);
              iVar3 = Bstrlib::String::getLength((String *)local_28);
              local_fc = Bstrlib::String::reverseFind((String *)local_28,'/',iVar3);
              if (local_fc != -1) {
                Bstrlib::String::midString((String *)&stack0xfffffffffffffef0,(int)local_28,0);
                Bstrlib::String::operator=((String *)local_28,(String *)&stack0xfffffffffffffef0);
                Bstrlib::String::~String((String *)&stack0xfffffffffffffef0);
              }
            }
          }
        }
      }
    }
  }
  Bstrlib::String::operator=((String *)outputStack.super_tagbstring.data,(String *)local_28);
  Bstrlib::String::~String((String *)local_28);
  return;
}

Assistant:

void URL::normalizePath(String & pathToNormalize) const
        {
            String outputStack;

            while (pathToNormalize.getLength())
            {
                if (pathToNormalize.midString(0, 3) == "../") pathToNormalize = pathToNormalize.midString(3, pathToNormalize.getLength());
                else if (pathToNormalize.midString(0, 2) == "./") pathToNormalize = pathToNormalize.midString(2, pathToNormalize.getLength());
                else if (pathToNormalize.midString(0, 3) == "/./") pathToNormalize = "/" + pathToNormalize.midString(3, pathToNormalize.getLength());
                else if (pathToNormalize == "/.") pathToNormalize = "/" + pathToNormalize.midString(2, pathToNormalize.getLength());
                else if (pathToNormalize.midString(0, 3) == "/.." || pathToNormalize == "/../")
                {
                    pathToNormalize = "/" + pathToNormalize.midString(4, pathToNormalize.getLength());
                    int lastSegmentPos = outputStack.reverseFind('/', outputStack.getLength());
                    if (lastSegmentPos != -1) outputStack = outputStack.midString(0, lastSegmentPos);
                }
                else if (pathToNormalize.invFindAnyChar(".", 0) == -1) pathToNormalize = "";
                else
                {
                    int firstSlash = pathToNormalize.Find('/', 0);
                    if (firstSlash == 0) firstSlash = pathToNormalize.Find('/', 1);
                    if (firstSlash == -1) { outputStack += pathToNormalize; pathToNormalize = ""; }
                    else
                    {
                        outputStack += pathToNormalize.midString(0, firstSlash);
                        pathToNormalize = pathToNormalize.midString(firstSlash, pathToNormalize.getLength());
                    }
                }
            }
            pathToNormalize = outputStack;
        }